

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

uint8 * google::protobuf::internal::WireFormatLite::WriteFixedNoTagToArray<double>
                  (RepeatedField<double> *value,_func_uint8_ptr_double_uint8_ptr *Writer,
                  uint8 *target)

{
  int iVar1;
  LogMessage *other;
  double *__src;
  size_t __n;
  LogFinisher local_59;
  LogMessage local_58;
  
  iVar1 = value->current_size_;
  if (iVar1 < 1) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite_inl.h"
               ,0x2b7);
    other = LogMessage::operator<<(&local_58,"CHECK failed: (n) > (0): ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  __src = RepeatedField<double>::unsafe_data(value);
  __n = (size_t)(iVar1 << 3);
  memcpy(target,__src,__n);
  return target + __n;
}

Assistant:

inline uint8* WireFormatLite::WriteFixedNoTagToArray(
      const RepeatedField<T>& value,
      uint8* (*Writer)(T, uint8*), uint8* target) {
#if defined(PROTOBUF_LITTLE_ENDIAN)
  (void) Writer;

  const int n = value.size();
  GOOGLE_DCHECK_GT(n, 0);

  const T* ii = value.unsafe_data();
  const int bytes = n * sizeof(ii[0]);
  memcpy(target, ii, bytes);
  return target + bytes;
#else
  return WritePrimitiveNoTagToArray(value, Writer, target);
#endif
}